

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_WarningForReservedNameNotIdentifier_Test::
~CommandLineInterfaceTest_WarningForReservedNameNotIdentifier_Test
          (CommandLineInterfaceTest_WarningForReservedNameNotIdentifier_Test *this)

{
  CommandLineInterfaceTester::~CommandLineInterfaceTester((CommandLineInterfaceTester *)this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, WarningForReservedNameNotIdentifier) {
  CreateTempFile("foo.proto", R"schema(
    syntax = "proto2";
    package foo;
    message Foo {
      reserved "not ident";
    })schema");

  Run("protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto");
  ExpectNoErrors();
  ExpectWarningSubstring(
      "Reserved name \"not ident\" is not a valid identifier.");
}